

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

CHAR LocalRegionGrayValuePredictTI(IplImage *pImage)

{
  uint uVar1;
  uint local_2c;
  int local_28;
  INT32U min_value;
  INT32U sum_value;
  INT32U locate_value;
  INT32U col;
  INT32U row;
  IplImage *pImage_local;
  
  local_28 = 0;
  local_2c = 300;
  for (locate_value = 1; locate_value < 5; locate_value = locate_value + 1) {
    for (sum_value = 1; sum_value < 6; sum_value = sum_value + 1) {
      uVar1 = 0xff - pImage->imageData[locate_value * pImage->widthStep + sum_value];
      local_28 = uVar1 + local_28;
      if (uVar1 < local_2c) {
        local_2c = uVar1;
      }
    }
  }
  for (locate_value = 1; locate_value < 5; locate_value = locate_value + 1) {
    for (sum_value = 9; sum_value < 0xe; sum_value = sum_value + 1) {
      uVar1 = 0xff - pImage->imageData[locate_value * pImage->widthStep + sum_value];
      local_28 = uVar1 + local_28;
      if (uVar1 < local_2c) {
        local_2c = uVar1;
      }
    }
  }
  if (local_28 + local_2c * -0x24 < 0x525) {
    pImage_local._7_1_ = 'I';
  }
  else {
    pImage_local._7_1_ = 'T';
  }
  return pImage_local._7_1_;
}

Assistant:

CHAR LocalRegionGrayValuePredictTI(IplImage *pImage) {
    INT32U row, col, locate_value, sum_value = 0, min_value = 300;
//    区域 [1:5,1:6], 4*5
    for (row = 1; row < 5; row++) {
        for (col = 1; col < 6; col++) {
            // get the pixel, 黑白颠倒
            locate_value = (INT32U) (255 - pImage->imageData[row * pImage->widthStep + col]);
            sum_value += locate_value;
            if (locate_value < min_value) {
                min_value = locate_value;
            }
        }
    }
//    区域 [1:5,9:14],4*4
    for (row = 1; row < 5; row++) {
        for (col = 9; col < 14; col++) {
            // get the pixel, 黑白颠倒
            locate_value = (INT32U) (255 - pImage->imageData[row * pImage->widthStep + col]);
            sum_value += locate_value;
            if (locate_value < min_value) {
                min_value = locate_value;
            }
        }
    }
//    总共40个像素点：4*5+4*4=36
//    printf("%d,%d,%d\n",sum_value,min_value,(sum_value-min_value*36));
    if (sum_value - min_value * 36 > 1316)
        return 'T';
    else
        return 'I';
}